

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O0

void __thiscall
ConfidentialTxInReference_EstimateTxInSize_Test::TestBody
          (ConfidentialTxInReference_EstimateTxInSize_Test *this)

{
  AddressType addr_type;
  int minimum_bits;
  initializer_list<TestEstimateConfidentialTxInRefVector> __l;
  bool bVar1;
  int iVar2;
  reference tx_in;
  ulong uVar3;
  char *pcVar4;
  TestEstimateConfidentialTxInRefVector *local_2cf8;
  AssertHelper local_29f8;
  Message local_29f0;
  undefined1 local_29e8 [8];
  AssertionResult gtest_ar_1;
  Message local_29d0;
  undefined1 local_29c8 [8];
  AssertionResult gtest_ar;
  Message local_29b0 [2];
  Script local_29a0;
  Script local_2968;
  undefined1 local_2930 [8];
  ConfidentialTxInReference txin_ref;
  Script *template_ptr;
  Script script_template;
  uint32_t wit_size;
  uint32_t size;
  TestEstimateConfidentialTxInRefVector *test_data;
  const_iterator __end1;
  const_iterator __begin1;
  vector<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
  *__range1;
  undefined1 local_2760;
  undefined1 local_275f;
  allocator local_275e;
  undefined1 local_275d;
  undefined1 local_275c;
  undefined1 local_275b;
  allocator local_275a;
  undefined1 local_2759;
  undefined1 local_2758;
  undefined1 local_2757;
  allocator local_2756;
  undefined1 local_2755;
  undefined1 local_2754;
  undefined1 local_2753;
  allocator local_2752;
  undefined1 local_2751;
  undefined1 local_2750;
  undefined1 local_274f;
  allocator local_274e;
  undefined1 local_274d;
  undefined1 local_274c;
  undefined1 local_274b;
  allocator local_274a;
  allocator local_2749;
  string local_2748;
  undefined1 local_2721;
  undefined1 local_2720;
  undefined1 local_271f;
  allocator local_271e;
  undefined1 local_271d;
  undefined1 local_271c;
  undefined1 local_271b;
  allocator local_271a;
  undefined1 local_2719;
  undefined1 local_2718;
  undefined1 local_2717;
  allocator local_2716;
  undefined1 local_2715;
  undefined1 local_2714;
  undefined1 local_2713;
  allocator local_2712;
  allocator local_2711;
  string local_2710;
  undefined1 local_26ec;
  undefined1 local_26eb;
  undefined1 local_26ea;
  allocator local_26e9;
  undefined1 local_26e8;
  undefined1 local_26e7;
  undefined1 local_26e6;
  allocator local_26e5;
  undefined1 local_26e4;
  undefined1 local_26e3;
  undefined1 local_26e2;
  allocator local_26e1;
  TestEstimateConfidentialTxInRefVector *local_26e0;
  TestEstimateConfidentialTxInRefVector local_26d8;
  ConfidentialTxIn local_24c8;
  undefined4 local_2368;
  undefined4 local_2364;
  undefined4 local_2360;
  Script SStack_2358;
  Script SStack_2320;
  undefined1 local_22e8;
  string asStack_22e0 [32];
  undefined4 local_22c0;
  undefined4 local_22bc;
  ConfidentialTxIn local_22b8;
  undefined4 local_2158;
  undefined4 local_2154;
  undefined4 local_2150;
  Script SStack_2148;
  Script SStack_2110;
  undefined1 local_20d8;
  string asStack_20d0 [32];
  undefined4 local_20b0;
  undefined4 local_20ac;
  ConfidentialTxIn local_20a8;
  undefined4 local_1f48;
  undefined4 local_1f44;
  undefined4 local_1f40;
  Script SStack_1f38;
  Script SStack_1f00;
  undefined1 local_1ec8;
  string asStack_1ec0 [32];
  undefined4 local_1ea0;
  undefined4 local_1e9c;
  ConfidentialTxIn local_1e98;
  undefined4 local_1d38;
  undefined4 local_1d34;
  undefined4 local_1d30;
  Script SStack_1d28;
  Script SStack_1cf0;
  undefined1 local_1cb8;
  string asStack_1cb0 [32];
  undefined4 local_1c90;
  undefined4 local_1c8c;
  ConfidentialTxIn local_1c88;
  undefined4 local_1b28;
  undefined4 local_1b24;
  undefined4 local_1b20;
  Script SStack_1b18;
  Script SStack_1ae0;
  undefined1 local_1aa8;
  string asStack_1aa0 [32];
  undefined4 local_1a80;
  undefined4 local_1a7c;
  ConfidentialTxIn local_1a78;
  undefined4 local_1918;
  undefined4 local_1914;
  undefined4 local_1910;
  Script SStack_1908;
  Script SStack_18d0;
  undefined1 local_1898;
  string asStack_1890 [32];
  undefined4 local_1870;
  undefined4 local_186c;
  ConfidentialTxIn local_1868;
  undefined4 local_1708;
  undefined4 local_1704;
  undefined4 local_1700;
  Script SStack_16f8;
  Script SStack_16c0;
  undefined1 local_1688;
  string asStack_1680 [32];
  undefined4 local_1660;
  undefined4 local_165c;
  ConfidentialTxIn local_1658;
  undefined4 local_14f8;
  undefined4 local_14f4;
  undefined4 local_14f0;
  Script SStack_14e8;
  Script SStack_14b0;
  undefined1 local_1478;
  string asStack_1470 [32];
  undefined4 local_1450;
  undefined4 local_144c;
  ConfidentialTxIn local_1448;
  undefined4 local_12e8;
  undefined4 local_12e4;
  undefined4 local_12e0;
  Script SStack_12d8;
  Script SStack_12a0;
  undefined1 local_1268;
  string asStack_1260 [32];
  undefined4 local_1240;
  undefined4 local_123c;
  ConfidentialTxIn local_1238;
  undefined4 local_10d8;
  undefined4 local_10d4;
  undefined4 local_10d0;
  Script SStack_10c8;
  Script SStack_1090;
  undefined1 local_1058;
  string asStack_1050 [32];
  undefined4 local_1030;
  undefined4 local_102c;
  ConfidentialTxIn local_1028;
  undefined4 local_ec8;
  undefined4 local_ec4;
  undefined4 local_ec0;
  Script SStack_eb8;
  Script SStack_e80;
  undefined1 local_e48;
  string asStack_e40 [32];
  undefined4 local_e20;
  undefined4 local_e1c;
  ConfidentialTxIn local_e18;
  undefined4 local_cb8;
  undefined4 local_cb4;
  undefined4 local_cb0;
  Script SStack_ca8;
  Script SStack_c70;
  undefined1 local_c38;
  string asStack_c30 [32];
  undefined4 local_c10;
  undefined4 local_c0c;
  ConfidentialTxIn local_c08;
  undefined4 local_aa8;
  undefined4 local_aa4;
  undefined4 local_aa0;
  Script SStack_a98;
  Script SStack_a60;
  undefined1 local_a28;
  string asStack_a20 [32];
  undefined4 local_a00;
  undefined4 local_9fc;
  undefined1 local_9f8 [24];
  vector<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
  test_vector;
  ByteData local_9b8;
  ConfidentialValue local_9a0;
  ByteData256 local_978;
  ByteData256 local_960;
  ByteData local_948;
  ByteData local_930;
  ByteData256 local_918;
  ByteData256 local_900;
  allocator local_8e1;
  string local_8e0;
  undefined1 local_8c0 [8];
  BlindFactor blind_factor;
  string local_898;
  undefined1 local_878 [8];
  BlindFactor entropy;
  ConfidentialValue inflation_keys;
  ConfidentialValue issuance_amount;
  ConfidentialTxIn reissue_txin;
  ConfidentialTxIn issue_txin;
  string local_540;
  ByteData local_520;
  ScriptWitness local_508;
  allocator local_4e1;
  string local_4e0;
  ByteData local_4c0;
  ScriptWitness local_4a8;
  allocator local_481;
  string local_480;
  ByteData local_460;
  ScriptWitness local_448;
  allocator local_421;
  string local_420;
  ByteData local_400;
  ScriptWitness local_3e8;
  allocator local_3c1;
  string local_3c0;
  ByteData local_3a0;
  ScriptWitness local_388;
  allocator local_361;
  string local_360;
  ByteData local_340;
  ScriptWitness local_328;
  undefined1 local_308 [8];
  ConfidentialTxIn pegin_txin;
  ConfidentialTxIn txin;
  Amount token_amount;
  Amount issue_amount;
  allocator local_11;
  ConfidentialTxInReference_EstimateTxInSize_Test *local_10;
  ConfidentialTxInReference_EstimateTxInSize_Test *this_local;
  
  local_10 = this;
  if ((TestBody()::multisig_script_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&TestBody()::multisig_script_abi_cxx11_), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&TestBody()::multisig_script_abi_cxx11_,
               "522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae"
               ,&local_11);
    std::allocator<char>::~allocator((allocator<char> *)&local_11);
    __cxa_atexit(std::__cxx11::string::~string,&TestBody()::multisig_script_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&TestBody()::multisig_script_abi_cxx11_);
  }
  if ((TestBody()::scriptsig_template_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&TestBody()::scriptsig_template_abi_cxx11_), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&TestBody()::scriptsig_template_abi_cxx11_,
               "00473044022047ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f0220217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb014752210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec552ae"
               ,(allocator *)&issue_amount.field_0xb);
    std::allocator<char>::~allocator((allocator<char> *)&issue_amount.field_0xb);
    __cxa_atexit(std::__cxx11::string::~string,&TestBody()::scriptsig_template_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&TestBody()::scriptsig_template_abi_cxx11_);
  }
  cfd::core::Amount::Amount((Amount *)&token_amount.ignore_check_,10000000);
  cfd::core::Amount::Amount
            ((Amount *)
             &txin.pegin_witness_.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,10000000);
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            ((ConfidentialTxIn *)
             &pegin_txin.pegin_witness_.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ConfidentialTxIn::ConfidentialTxIn((ConfidentialTxIn *)local_308);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_360,"00e1f50500000000",&local_361);
  cfd::core::ByteData::ByteData(&local_340,&local_360);
  cfd::core::ConfidentialTxIn::AddPeginWitnessStack
            (&local_328,(ConfidentialTxIn *)local_308,&local_340);
  cfd::core::ScriptWitness::~ScriptWitness(&local_328);
  cfd::core::ByteData::~ByteData(&local_340);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3c0,"c23bd031406aa9f7ac994f7385cd8d2605adaadf5a473c82557b4586192681d3"
             ,&local_3c1);
  cfd::core::ByteData::ByteData(&local_3a0,&local_3c0);
  cfd::core::ConfidentialTxIn::AddPeginWitnessStack
            (&local_388,(ConfidentialTxIn *)local_308,&local_3a0);
  cfd::core::ScriptWitness::~ScriptWitness(&local_388);
  cfd::core::ByteData::~ByteData(&local_3a0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_420,"06226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f"
             ,&local_421);
  cfd::core::ByteData::ByteData(&local_400,&local_420);
  cfd::core::ConfidentialTxIn::AddPeginWitnessStack
            (&local_3e8,(ConfidentialTxIn *)local_308,&local_400);
  cfd::core::ScriptWitness::~ScriptWitness(&local_3e8);
  cfd::core::ByteData::~ByteData(&local_400);
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_480,"0014e8d28b573816ddfcf98578d7b28543e273f5a72a",&local_481);
  cfd::core::ByteData::ByteData(&local_460,&local_480);
  cfd::core::ConfidentialTxIn::AddPeginWitnessStack
            (&local_448,(ConfidentialTxIn *)local_308,&local_460);
  cfd::core::ScriptWitness::~ScriptWitness(&local_448);
  cfd::core::ByteData::~ByteData(&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4e0,
             "02000000014578ddc14da3e19445b6e7b4c61d4af711d29e2703161aa9c11e4e6b0ea08843010000006b483045022100eea27e89c3cf2867393263bece040f34c03e0cddfa93a1a18c0d2e4322a37df7022074273c0ab3836affba53737c83673ca6c0d69bffdf722b4accfd7c0a9b2ea4e60121020bfcdbda850cd250c3995dfdb426dc40a9c8a5b378be2bf39f6b0642a783daf2feffffff02281d2418010000001976a914b56872c7b363bfb3f5af84d071ff282cf2abfe3988ac00e1f5050000000017a9141d4796c6e855ae00acecb0c20f65dd8bbeffb1ec87d1000000"
             ,&local_4e1);
  cfd::core::ByteData::ByteData(&local_4c0,&local_4e0);
  cfd::core::ConfidentialTxIn::AddPeginWitnessStack
            (&local_4a8,(ConfidentialTxIn *)local_308,&local_4c0);
  cfd::core::ScriptWitness::~ScriptWitness(&local_4a8);
  cfd::core::ByteData::~ByteData(&local_4c0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_540,
             "03000030ffba1d575800bf37a1ee1962dee7e153c18bcfc93cd013e7c297d5363b36cc2d63d5c4a9fdc746b9d3f4f62995d611c34ee9740ff2b5193ce458fdac6d173800ec402e5affff7f200500000002000000027ce06590120cf8c2bef7726200f0fa655940cadcf62708d7dc9f8f2a417c890b81af4d4299758e7e7a0daa6e7e3d3ec37f97df4ef2392ae5e6d286fc5e7e01d90105"
             ,(allocator *)
              ((long)&issue_txin.pegin_witness_.witness_stack_.
                      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData::ByteData(&local_520,&local_540);
  cfd::core::ConfidentialTxIn::AddPeginWitnessStack
            (&local_508,(ConfidentialTxIn *)local_308,&local_520);
  cfd::core::ScriptWitness::~ScriptWitness(&local_508);
  cfd::core::ByteData::~ByteData(&local_520);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&issue_txin.pegin_witness_.witness_stack_.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            ((ConfidentialTxIn *)
             &reissue_txin.pegin_witness_.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ConfidentialTxIn::ConfidentialTxIn((ConfidentialTxIn *)&issuance_amount.version_);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&inflation_keys.version_,(Amount *)&token_amount.ignore_check_);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)
             &entropy.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (Amount *)
             &txin.pegin_witness_.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_898,"6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306"
             ,(allocator *)
              ((long)&blind_factor.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)local_878,&local_898);
  std::__cxx11::string::~string((string *)&local_898);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&blind_factor.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_8e0,"c8082e8f6980cb5c938cbeff8d72fd5109eddc337417c3b7a7e62deb9a1b9acf"
             ,&local_8e1);
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)local_8c0,&local_8e0);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e1);
  cfd::core::ByteData256::ByteData256(&local_900);
  cfd::core::ByteData256::ByteData256(&local_918);
  cfd::core::ByteData::ByteData(&local_930);
  cfd::core::ByteData::ByteData(&local_948);
  cfd::core::ConfidentialTxIn::SetIssuance
            ((ConfidentialTxIn *)
             &reissue_txin.pegin_witness_.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_900,&local_918,
             (ConfidentialValue *)&inflation_keys.version_,
             (ConfidentialValue *)
             &entropy.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_930,&local_948);
  cfd::core::ByteData::~ByteData(&local_948);
  cfd::core::ByteData::~ByteData(&local_930);
  cfd::core::ByteData256::~ByteData256(&local_918);
  cfd::core::ByteData256::~ByteData256(&local_900);
  cfd::core::BlindFactor::GetData(&local_960,(BlindFactor *)local_878);
  cfd::core::BlindFactor::GetData(&local_978,(BlindFactor *)local_8c0);
  cfd::core::ConfidentialValue::ConfidentialValue(&local_9a0);
  cfd::core::ByteData::ByteData(&local_9b8);
  cfd::core::ByteData::ByteData
            ((ByteData *)
             &test_vector.
              super__Vector_base<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ConfidentialTxIn::SetIssuance
            ((ConfidentialTxIn *)&issuance_amount.version_,&local_960,&local_978,
             (ConfidentialValue *)&inflation_keys.version_,&local_9a0,&local_9b8,
             (ByteData *)
             &test_vector.
              super__Vector_base<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &test_vector.
              super__Vector_base<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData(&local_9b8);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_9a0);
  cfd::core::ByteData256::~ByteData256(&local_978);
  cfd::core::ByteData256::~ByteData256(&local_960);
  __range1._6_1_ = 1;
  local_26e0 = &local_26d8;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            (&local_26e0->txin,
             (ConfidentialTxIn *)
             &pegin_txin.pegin_witness_.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_26e4 = 1;
  local_26d8.addr_type = kP2pkhAddress;
  local_26d8.size = 0x96;
  local_26d8.witness_size = 0;
  cfd::core::Script::Script(&local_26d8.redeem_script);
  local_26e3 = 1;
  cfd::core::Script::Script(&local_26d8.claim_script);
  local_26e2 = 1;
  local_26d8.is_blind = false;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_26d8.script_template,"",&local_26e1);
  local_26d8.exponent = 0;
  local_26d8.minimum_bits = 0;
  local_26e2 = 0;
  local_26e3 = 0;
  local_26e4 = 0;
  local_26e0 = (TestEstimateConfidentialTxInRefVector *)&local_24c8;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            ((ConfidentialTxIn *)local_26e0,
             (ConfidentialTxIn *)
             &pegin_txin.pegin_witness_.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_26e8 = 1;
  local_2368 = 1;
  local_2364 = 0xcd;
  local_2360 = 0;
  cfd::core::Script::Script(&SStack_2358,&exp_script);
  local_26e7 = 1;
  cfd::core::Script::Script(&SStack_2320);
  local_26e6 = 1;
  local_22e8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_22e0,"",&local_26e5);
  local_22c0 = 0;
  local_22bc = 0;
  local_26e6 = 0;
  local_26e7 = 0;
  local_26e8 = 0;
  local_26e0 = (TestEstimateConfidentialTxInRefVector *)&local_22b8;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            ((ConfidentialTxIn *)local_26e0,
             (ConfidentialTxIn *)
             &pegin_txin.pegin_witness_.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_26ec = 1;
  local_2158 = 6;
  local_2154 = 0xb0;
  local_2150 = 0x70;
  cfd::core::Script::Script(&SStack_2148);
  local_26eb = 1;
  cfd::core::Script::Script(&SStack_2110);
  local_26ea = 1;
  local_20d8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_20d0,"",&local_26e9);
  local_20b0 = 0;
  local_20ac = 0;
  local_26ea = 0;
  local_26eb = 0;
  local_26ec = 0;
  local_26e0 = (TestEstimateConfidentialTxInRefVector *)&local_20a8;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            ((ConfidentialTxIn *)local_26e0,
             (ConfidentialTxIn *)
             &pegin_txin.pegin_witness_.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_2715 = 1;
  local_1f48 = 5;
  local_1f44 = 0xde;
  local_1f40 = 0x92;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2710,"51",&local_2711);
  cfd::core::Script::Script(&SStack_1f38,&local_2710);
  local_2714 = 1;
  cfd::core::Script::Script(&SStack_1f00);
  local_2713 = 1;
  local_1ec8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1ec0,"",&local_2712);
  local_1ea0 = 0;
  local_1e9c = 0;
  local_2713 = 0;
  local_2714 = 0;
  local_2715 = 0;
  local_26e0 = (TestEstimateConfidentialTxInRefVector *)&local_1e98;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            ((ConfidentialTxIn *)local_26e0,
             (ConfidentialTxIn *)
             &pegin_txin.pegin_witness_.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_2719 = 1;
  local_1d38 = 4;
  local_1d34 = 0x99;
  local_1d30 = 0x70;
  cfd::core::Script::Script(&SStack_1d28);
  local_2718 = 1;
  cfd::core::Script::Script(&SStack_1cf0);
  local_2717 = 1;
  local_1cb8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1cb0,"",&local_2716);
  local_1c90 = 0;
  local_1c8c = 0;
  local_2717 = 0;
  local_2718 = 0;
  local_2719 = 0;
  local_26e0 = (TestEstimateConfidentialTxInRefVector *)&local_1c88;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            ((ConfidentialTxIn *)local_26e0,
             (ConfidentialTxIn *)
             &pegin_txin.pegin_witness_.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_271d = 1;
  local_1b28 = 3;
  local_1b24 = 0xd0;
  local_1b20 = 0xa7;
  cfd::core::Script::Script(&SStack_1b18,&exp_script);
  local_271c = 1;
  cfd::core::Script::Script(&SStack_1ae0);
  local_271b = 1;
  local_1aa8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1aa0,"",&local_271a);
  local_1a80 = 0;
  local_1a7c = 0;
  local_271b = 0;
  local_271c = 0;
  local_271d = 0;
  local_26e0 = (TestEstimateConfidentialTxInRefVector *)&local_1a78;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            ((ConfidentialTxIn *)local_26e0,
             (ConfidentialTxIn *)
             &pegin_txin.pegin_witness_.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_2721 = 1;
  local_1918 = 3;
  local_1914 = 0x12d;
  local_1910 = 0x104;
  cfd::core::Script::Script(&SStack_1908,&TestBody()::multisig_script_abi_cxx11_);
  local_2720 = 1;
  cfd::core::Script::Script(&SStack_18d0);
  local_271f = 1;
  local_1898 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1890,"",&local_271e);
  local_1870 = 0;
  local_186c = 0;
  local_271f = 0;
  local_2720 = 0;
  local_2721 = 0;
  local_26e0 = (TestEstimateConfidentialTxInRefVector *)&local_1868;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            ((ConfidentialTxIn *)local_26e0,
             (ConfidentialTxIn *)
             &pegin_txin.pegin_witness_.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_1708 = 3;
  local_1704 = 0xbf;
  local_1700 = 0x96;
  cfd::core::Script::Script(&SStack_16f8,&exp_script);
  cfd::core::Script::Script(&SStack_16c0);
  local_1688 = 0;
  std::__cxx11::string::string(asStack_1680,(string *)&TestBody()::scriptsig_template_abi_cxx11_);
  local_1660 = 0;
  local_165c = 0;
  local_26e0 = (TestEstimateConfidentialTxInRefVector *)&local_1658;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            ((ConfidentialTxIn *)local_26e0,(ConfidentialTxIn *)local_308);
  local_274d = 1;
  local_14f8 = 4;
  local_14f4 = 0x284;
  local_14f0 = 0x25b;
  cfd::core::Script::Script(&SStack_14e8);
  local_274c = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2748,
             "0020e8d28b573816ddfcf98578d7b28543e273f5a72a112233445566778899aabbccdd",&local_2749);
  cfd::core::Script::Script(&SStack_14b0,&local_2748);
  local_274b = 1;
  local_1478 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1470,"",&local_274a);
  local_1450 = 0;
  local_144c = 0;
  local_274b = 0;
  local_274c = 0;
  local_274d = 0;
  local_26e0 = (TestEstimateConfidentialTxInRefVector *)&local_1448;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            ((ConfidentialTxIn *)local_26e0,
             (ConfidentialTxIn *)
             &reissue_txin.pegin_witness_.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_2751 = 1;
  local_12e8 = 4;
  local_12e4 = 0x102f;
  local_12e0 = 0xf84;
  cfd::core::Script::Script(&SStack_12d8);
  local_2750 = 1;
  cfd::core::Script::Script(&SStack_12a0);
  local_274f = 1;
  local_1268 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1260,"",&local_274e);
  local_1240 = 0;
  local_123c = 0;
  local_274f = 0;
  local_2750 = 0;
  local_2751 = 0;
  local_26e0 = (TestEstimateConfidentialTxInRefVector *)&local_1238;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            ((ConfidentialTxIn *)local_26e0,
             (ConfidentialTxIn *)
             &reissue_txin.pegin_witness_.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_2755 = 1;
  local_10d8 = 4;
  local_10d4 = 0x17b1;
  local_10d0 = 0x1706;
  cfd::core::Script::Script(&SStack_10c8);
  local_2754 = 1;
  cfd::core::Script::Script(&SStack_1090);
  local_2753 = 1;
  local_1058 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1050,"",&local_2752);
  local_1030 = 0;
  local_102c = 0x24;
  local_2753 = 0;
  local_2754 = 0;
  local_2755 = 0;
  local_26e0 = (TestEstimateConfidentialTxInRefVector *)&local_1028;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            ((ConfidentialTxIn *)local_26e0,
             (ConfidentialTxIn *)
             &reissue_txin.pegin_witness_.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_2759 = 1;
  local_ec8 = 4;
  local_ec4 = 0x21b3;
  local_ec0 = 0x2108;
  cfd::core::Script::Script(&SStack_eb8);
  local_2758 = 1;
  cfd::core::Script::Script(&SStack_e80);
  local_2757 = 1;
  local_e48 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_e40,"",&local_2756);
  local_e20 = 0;
  local_e1c = 0x34;
  local_2757 = 0;
  local_2758 = 0;
  local_2759 = 0;
  local_26e0 = (TestEstimateConfidentialTxInRefVector *)&local_e18;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            ((ConfidentialTxIn *)local_26e0,(ConfidentialTxIn *)&issuance_amount.version_);
  local_275d = 1;
  local_cb8 = 4;
  local_cb4 = 0xc66;
  local_cb0 = 0xbbb;
  cfd::core::Script::Script(&SStack_ca8);
  local_275c = 1;
  cfd::core::Script::Script(&SStack_c70);
  local_275b = 1;
  local_c38 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_c30,"",&local_275a);
  local_c10 = 0;
  local_c0c = 0x24;
  local_275b = 0;
  local_275c = 0;
  local_275d = 0;
  local_26e0 = (TestEstimateConfidentialTxInRefVector *)&local_c08;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            ((ConfidentialTxIn *)local_26e0,(ConfidentialTxIn *)&issuance_amount.version_);
  __range1._7_1_ = 1;
  local_aa8 = 4;
  local_aa4 = 0x1167;
  local_aa0 = 0x10bc;
  cfd::core::Script::Script(&SStack_a98);
  local_2760 = 1;
  cfd::core::Script::Script(&SStack_a60);
  local_275f = 1;
  local_a28 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_a20,"",&local_275e);
  local_a00 = 0;
  local_9fc = 0x34;
  local_275f = 0;
  local_2760 = 0;
  __range1._7_1_ = 0;
  __range1._6_1_ = 0;
  local_9f8._0_8_ = &local_26d8;
  local_9f8._8_8_ = (_func_int **)0xe;
  std::allocator<TestEstimateConfidentialTxInRefVector>::allocator
            ((allocator<TestEstimateConfidentialTxInRefVector> *)((long)&__range1 + 5));
  __l._M_len = local_9f8._8_8_;
  __l._M_array = (iterator)local_9f8._0_8_;
  std::
  vector<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
  ::vector((vector<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
            *)(local_9f8 + 0x10),__l,
           (allocator<TestEstimateConfidentialTxInRefVector> *)((long)&__range1 + 5));
  std::allocator<TestEstimateConfidentialTxInRefVector>::~allocator
            ((allocator<TestEstimateConfidentialTxInRefVector> *)((long)&__range1 + 5));
  local_2cf8 = (TestEstimateConfidentialTxInRefVector *)local_9f8;
  do {
    local_2cf8 = local_2cf8 + -1;
    TestEstimateConfidentialTxInRefVector::~TestEstimateConfidentialTxInRefVector(local_2cf8);
  } while (local_2cf8 != &local_26d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_275e);
  std::allocator<char>::~allocator((allocator<char> *)&local_275a);
  std::allocator<char>::~allocator((allocator<char> *)&local_2756);
  std::allocator<char>::~allocator((allocator<char> *)&local_2752);
  std::allocator<char>::~allocator((allocator<char> *)&local_274e);
  std::allocator<char>::~allocator((allocator<char> *)&local_274a);
  std::__cxx11::string::~string((string *)&local_2748);
  std::allocator<char>::~allocator((allocator<char> *)&local_2749);
  std::allocator<char>::~allocator((allocator<char> *)&local_271e);
  std::allocator<char>::~allocator((allocator<char> *)&local_271a);
  std::allocator<char>::~allocator((allocator<char> *)&local_2716);
  std::allocator<char>::~allocator((allocator<char> *)&local_2712);
  std::__cxx11::string::~string((string *)&local_2710);
  std::allocator<char>::~allocator((allocator<char> *)&local_2711);
  std::allocator<char>::~allocator((allocator<char> *)&local_26e9);
  std::allocator<char>::~allocator((allocator<char> *)&local_26e5);
  std::allocator<char>::~allocator((allocator<char> *)&local_26e1);
  __end1 = std::
           vector<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
           ::begin((vector<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
                    *)(local_9f8 + 0x10));
  test_data = (TestEstimateConfidentialTxInRefVector *)
              std::
              vector<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
              ::end((vector<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
                     *)(local_9f8 + 0x10));
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_TestEstimateConfidentialTxInRefVector_*,_std::vector<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>_>
                                     *)&test_data), bVar1) {
    tx_in = __gnu_cxx::
            __normal_iterator<const_TestEstimateConfidentialTxInRefVector_*,_std::vector<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>_>
            ::operator*(&__end1);
    script_template.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    script_template.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    cfd::core::Script::Script((Script *)&template_ptr,&tx_in->script_template);
    txin_ref.pegin_witness_.witness_stack_.
    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      txin_ref.pegin_witness_.witness_stack_.
      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)&template_ptr;
    }
    cfd::core::ConfidentialTxInReference::ConfidentialTxInReference
              ((ConfidentialTxInReference *)local_2930,&tx_in->txin);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        addr_type = tx_in->addr_type;
        cfd::core::Script::Script(&local_2968,&tx_in->redeem_script);
        bVar1 = tx_in->is_blind;
        iVar2 = tx_in->exponent;
        minimum_bits = tx_in->minimum_bits;
        cfd::core::Script::Script(&local_29a0,&tx_in->claim_script);
        script_template.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             cfd::core::ConfidentialTxInReference::EstimateTxInSize
                       ((ConfidentialTxInReference *)local_2930,addr_type,&local_2968,
                        (bool)(bVar1 & 1),iVar2,minimum_bits,&local_29a0,
                        (Script *)
                        txin_ref.pegin_witness_.witness_stack_.
                        super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (uint32_t *)
                        &script_template.script_stack_.
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(uint32_t *)0x0);
        cfd::core::Script::~Script(&local_29a0);
        cfd::core::Script::~Script(&local_2968);
      }
    }
    else {
      testing::Message::Message(local_29b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                 ,0x1d9,
                 "Expected: (size = txin_ref.EstimateTxInSize( test_data.addr_type, test_data.redeem_script, test_data.is_blind, test_data.exponent, test_data.minimum_bits, test_data.claim_script, template_ptr, &wit_size, nullptr)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_29b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
      testing::Message::~Message(local_29b0);
    }
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              ((EqHelper<false> *)local_29c8,"size","test_data.size",
               (uint *)((long)&script_template.script_stack_.
                               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),&tx_in->size)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_29c8);
    if (!bVar1) {
      testing::Message::Message(&local_29d0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_29c8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                 ,0x1da,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_29d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_29d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_29c8);
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              ((EqHelper<false> *)local_29e8,"wit_size","test_data.witness_size",
               (uint *)&script_template.script_stack_.
                        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&tx_in->witness_size);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_29e8);
    if (!bVar1) {
      testing::Message::Message(&local_29f0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_29e8);
      testing::internal::AssertHelper::AssertHelper
                (&local_29f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                 ,0x1db,pcVar4);
      testing::internal::AssertHelper::operator=(&local_29f8,&local_29f0);
      testing::internal::AssertHelper::~AssertHelper(&local_29f8);
      testing::Message::~Message(&local_29f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_29e8);
    cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
              ((ConfidentialTxInReference *)local_2930);
    cfd::core::Script::~Script((Script *)&template_ptr);
    __gnu_cxx::
    __normal_iterator<const_TestEstimateConfidentialTxInRefVector_*,_std::vector<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
  ::~vector((vector<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
             *)(local_9f8 + 0x10));
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)local_8c0);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)local_878);
  cfd::core::ConfidentialValue::~ConfidentialValue
            ((ConfidentialValue *)
             &entropy.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&inflation_keys.version_);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn((ConfidentialTxIn *)&issuance_amount.version_);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn
            ((ConfidentialTxIn *)
             &reissue_txin.pegin_witness_.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn((ConfidentialTxIn *)local_308);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn
            ((ConfidentialTxIn *)
             &pegin_txin.pegin_witness_.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(ConfidentialTxInReference, EstimateTxInSize) {
  static const std::string multisig_script = "522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae";
  static const std::string scriptsig_template = "00473044022047ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f0220217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb014752210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec552ae";

  Amount issue_amount(uint32_t{10000000});
  Amount token_amount(uint32_t{10000000});
  ConfidentialTxIn txin;
  ConfidentialTxIn pegin_txin;
  {
    pegin_txin.AddPeginWitnessStack(ByteData("00e1f50500000000"));
    pegin_txin.AddPeginWitnessStack(
        ByteData(
            "c23bd031406aa9f7ac994f7385cd8d2605adaadf5a473c82557b4586192681d3"));
    pegin_txin.AddPeginWitnessStack(
        ByteData(
            "06226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f"));
    pegin_txin.AddPeginWitnessStack(
        ByteData("0014e8d28b573816ddfcf98578d7b28543e273f5a72a"));
    pegin_txin.AddPeginWitnessStack(
        ByteData(
            "02000000014578ddc14da3e19445b6e7b4c61d4af711d29e2703161aa9c11e4e6b0ea08843010000006b483045022100eea27e89c3cf2867393263bece040f34c03e0cddfa93a1a18c0d2e4322a37df7022074273c0ab3836affba53737c83673ca6c0d69bffdf722b4accfd7c0a9b2ea4e60121020bfcdbda850cd250c3995dfdb426dc40a9c8a5b378be2bf39f6b0642a783daf2feffffff02281d2418010000001976a914b56872c7b363bfb3f5af84d071ff282cf2abfe3988ac00e1f5050000000017a9141d4796c6e855ae00acecb0c20f65dd8bbeffb1ec87d1000000"));
    pegin_txin.AddPeginWitnessStack(
        ByteData(
            "03000030ffba1d575800bf37a1ee1962dee7e153c18bcfc93cd013e7c297d5363b36cc2d63d5c4a9fdc746b9d3f4f62995d611c34ee9740ff2b5193ce458fdac6d173800ec402e5affff7f200500000002000000027ce06590120cf8c2bef7726200f0fa655940cadcf62708d7dc9f8f2a417c890b81af4d4299758e7e7a0daa6e7e3d3ec37f97df4ef2392ae5e6d286fc5e7e01d90105"));
  }
  ConfidentialTxIn issue_txin;
  ConfidentialTxIn reissue_txin;
  ConfidentialValue issuance_amount(issue_amount);
  ConfidentialValue inflation_keys(token_amount);
  BlindFactor entropy("6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306");
  BlindFactor blind_factor("c8082e8f6980cb5c938cbeff8d72fd5109eddc337417c3b7a7e62deb9a1b9acf");
  {
    issue_txin.SetIssuance(
        ByteData256(), ByteData256(), issuance_amount,
        inflation_keys, ByteData(), ByteData());
    reissue_txin.SetIssuance(
        entropy.GetData(), blind_factor.GetData(), issuance_amount,
        ConfidentialValue(), ByteData(), ByteData());
  }

  const std::vector<TestEstimateConfidentialTxInRefVector> test_vector = {
    {txin, AddressType::kP2pkhAddress, 150, 0, Script(), Script(), false, "", 0, 0},
    {txin, AddressType::kP2shAddress, 205, 0, exp_script, Script(), false, "", 0, 0},
    {txin, AddressType::kP2shP2wpkhAddress, 176, 112, Script(), Script(), false, "", 0, 0},
    {txin, AddressType::kP2shP2wshAddress, 222, 146, Script("51"), Script(), false, "", 0, 0},
    {txin, AddressType::kP2wpkhAddress, 153, 112, Script(), Script(), false, "", 0, 0},
    {txin, AddressType::kP2wshAddress, 208, 167, exp_script,Script(), false, "", 0, 0},
    {txin, AddressType::kP2wshAddress, 301, 260, Script(multisig_script), Script(), false,
      "", 0, 0},
    {txin, AddressType::kP2wshAddress, 191, 150, exp_script, Script(), false,
      scriptsig_template, 0, 0},
    // pegin (input claim script)
    {pegin_txin, AddressType::kP2wpkhAddress, 644, 603, Script(),
     Script("0020e8d28b573816ddfcf98578d7b28543e273f5a72a112233445566778899aabbccdd"),
     false, "", 0, 0},
    // issue
    {issue_txin, AddressType::kP2wpkhAddress, 4143, 3972, Script(), Script(), true, "", 0, 0},
    {issue_txin, AddressType::kP2wpkhAddress, 6065, 5894, Script(), Script(), true, "", 0, 36},
    {issue_txin, AddressType::kP2wpkhAddress, 8627, 8456, Script(), Script(), true, "", 0, 52},
    // reissue
    {reissue_txin, AddressType::kP2wpkhAddress, 3174, 3003, Script(), Script(), true, "", 0, 36},
    {reissue_txin, AddressType::kP2wpkhAddress, 4455, 4284, Script(),Script(), true, "", 0, 52},
  };

  for (const auto& test_data : test_vector) {
    uint32_t size = 0;
    uint32_t wit_size = 0;
    Script script_template(test_data.script_template);
    Script* template_ptr = nullptr;
    if (!test_data.script_template.empty()) {
      template_ptr = &script_template;
    }
    ConfidentialTxInReference txin_ref(test_data.txin);
    EXPECT_NO_THROW((size = txin_ref.EstimateTxInSize(
        test_data.addr_type, test_data.redeem_script, test_data.is_blind,
        test_data.exponent, test_data.minimum_bits, test_data.claim_script,
        template_ptr, &wit_size, nullptr)));
    EXPECT_EQ(size, test_data.size);
    EXPECT_EQ(wit_size, test_data.witness_size);
  }
}